

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int16_t iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  uint uVar16;
  uint uVar17;
  undefined4 uVar18;
  parasail_result_t *ppVar19;
  undefined1 (*ptr) [16];
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  short sVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  uint uVar49;
  ulong uVar50;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  uint uVar58;
  ulong uVar59;
  short sVar60;
  undefined1 auVar61 [32];
  undefined2 uVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  int16_t iVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  uint local_334;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  undefined1 local_158 [32];
  
  auVar77 = in_ZMM6._0_16_;
  if (_s2 == (char *)0x0) {
    parasail_nw_table_diag_avx2_256_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_table_diag_avx2_256_16_cold_6();
  }
  else if (open < 0) {
    parasail_nw_table_diag_avx2_256_16_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_table_diag_avx2_256_16_cold_4();
  }
  else {
    uVar59 = (ulong)(uint)_s1Len;
    if (matrix == (parasail_matrix_t *)0x0) {
      parasail_nw_table_diag_avx2_256_16_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_nw_table_diag_avx2_256_16_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_nw_table_diag_avx2_256_16_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar59 = (ulong)(uint)matrix->length;
      }
      iVar25 = -open;
      iVar23 = matrix->min;
      iVar28 = -iVar23;
      if (iVar23 != iVar25 && SBORROW4(iVar23,iVar25) == iVar23 + open < 0) {
        iVar28 = open;
      }
      sVar27 = 0x7ffe - (short)matrix->max;
      uVar29 = (uint)uVar59;
      ppVar19 = parasail_result_new_table1(uVar29,s2Len);
      if (ppVar19 != (parasail_result_t *)0x0) {
        ppVar19->flag = ppVar19->flag | 0x10221001;
        uVar55 = (ulong)(s2Len + 0x1e);
        ptr = (undefined1 (*) [16])parasail_memalign_int16_t(0x20,uVar55);
        ptr_00 = parasail_memalign_int16_t(0x20,uVar55);
        ptr_01 = parasail_memalign_int16_t(0x20,uVar55);
        if (ptr_01 != (int16_t *)0x0 &&
            (ptr_00 != (int16_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
          if (matrix->type == 0) {
            iVar23 = uVar29 + 0xf;
            ptr_02 = parasail_memalign_int16_t(0x20,(long)iVar23);
            if (ptr_02 == (int16_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < (int)uVar29) {
              piVar3 = matrix->mapper;
              uVar55 = 0;
              do {
                ptr_02[uVar55] = (int16_t)piVar3[(byte)_s1[uVar55]];
                uVar55 = uVar55 + 1;
              } while (uVar59 != uVar55);
            }
            iVar15 = uVar29 + 1;
            if ((int)(uVar29 + 1) < iVar23) {
              iVar15 = iVar23;
            }
            memset(ptr_02 + (int)uVar29,0,(ulong)(~uVar29 + iVar15) * 2 + 2);
          }
          else {
            ptr_02 = (int16_t *)0x0;
          }
          uVar26 = s2Len + 0xf;
          local_334 = uVar29 - 1;
          auVar78 = vpinsrw_avx(ZEXT416((uint)(gap * 0xfff9 - open)),gap * 0xfffa - open,1);
          auVar78 = vpinsrw_avx(auVar78,gap * 0xfffb - open,2);
          auVar78 = vpinsrw_avx(auVar78,iVar25 + gap * -4,3);
          auVar78 = vpinsrw_avx(auVar78,gap * 0xfffd - open,4);
          auVar78 = vpinsrw_avx(auVar78,iVar25 + gap * -2,5);
          auVar78 = vpinsrw_avx(auVar78,iVar25 - gap,6);
          auVar5 = vpinsrw_avx(ZEXT416((uint)(gap * 0xfff1 - open)),gap * 0xfff2 - open,1);
          auVar5 = vpinsrw_avx(auVar5,gap * 0xfff3 - open,2);
          auVar5 = vpinsrw_avx(auVar5,gap * 0xfff4 - open,3);
          auVar5 = vpinsrw_avx(auVar5,gap * 0xfff5 - open,4);
          iVar23 = s2Len + -1;
          iVar28 = iVar28 + -0x7fff;
          iVar69 = (int16_t)iVar28;
          uVar62 = (undefined2)open;
          sVar60 = (short)gap;
          auVar70._2_2_ = sVar60;
          auVar70._0_2_ = sVar60;
          auVar70._4_2_ = sVar60;
          auVar70._6_2_ = sVar60;
          auVar70._8_2_ = sVar60;
          auVar70._10_2_ = sVar60;
          auVar70._12_2_ = sVar60;
          auVar70._14_2_ = sVar60;
          auVar70._16_2_ = sVar60;
          auVar70._18_2_ = sVar60;
          auVar70._20_2_ = sVar60;
          auVar70._22_2_ = sVar60;
          auVar70._24_2_ = sVar60;
          auVar70._26_2_ = sVar60;
          auVar70._28_2_ = sVar60;
          auVar70._30_2_ = sVar60;
          auVar61._0_2_ = (undefined2)uVar59;
          auVar61._2_2_ = auVar61._0_2_;
          auVar61._4_2_ = auVar61._0_2_;
          auVar61._6_2_ = auVar61._0_2_;
          auVar61._8_2_ = auVar61._0_2_;
          auVar61._10_2_ = auVar61._0_2_;
          auVar61._12_2_ = auVar61._0_2_;
          auVar61._14_2_ = auVar61._0_2_;
          auVar61._16_2_ = auVar61._0_2_;
          auVar61._18_2_ = auVar61._0_2_;
          auVar61._20_2_ = auVar61._0_2_;
          auVar61._22_2_ = auVar61._0_2_;
          auVar61._24_2_ = auVar61._0_2_;
          auVar61._26_2_ = auVar61._0_2_;
          auVar61._28_2_ = auVar61._0_2_;
          auVar61._30_2_ = auVar61._0_2_;
          auVar67 = vpcmpeqd_avx2(ZEXT432((uint)open),ZEXT432((uint)open));
          auVar61 = vpaddsw_avx2(auVar61,auVar67);
          auVar65._0_2_ = (undefined2)s2Len;
          auVar65._2_2_ = auVar65._0_2_;
          auVar65._4_2_ = auVar65._0_2_;
          auVar65._6_2_ = auVar65._0_2_;
          auVar65._8_2_ = auVar65._0_2_;
          auVar65._10_2_ = auVar65._0_2_;
          auVar65._12_2_ = auVar65._0_2_;
          auVar65._14_2_ = auVar65._0_2_;
          auVar65._16_2_ = auVar65._0_2_;
          auVar65._18_2_ = auVar65._0_2_;
          auVar65._20_2_ = auVar65._0_2_;
          auVar65._22_2_ = auVar65._0_2_;
          auVar65._24_2_ = auVar65._0_2_;
          auVar65._26_2_ = auVar65._0_2_;
          auVar65._28_2_ = auVar65._0_2_;
          auVar65._30_2_ = auVar65._0_2_;
          auVar67 = vpaddsw_avx2(auVar65,auVar67);
          auVar78 = vpinsrw_avx(auVar78,iVar25,7);
          auVar5 = vpinsrw_avx(auVar5,gap * 0xfff6 - open,5);
          auVar5 = vpinsrw_avx(auVar5,gap * 0xfff7 - open,6);
          auVar5 = vpinsrw_avx(auVar5,iVar25 + gap * -8,7);
          auVar65 = vpsllw_avx2(auVar70,4);
          local_158._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar5;
          local_158._16_16_ = ZEXT116(1) * auVar78;
          piVar3 = matrix->mapper;
          uVar55 = 1;
          if (1 < s2Len) {
            uVar55 = (ulong)(uint)s2Len;
          }
          uVar24 = 0;
          do {
            *(short *)(ptr[1] + uVar24 * 2 + 0xe) = (short)piVar3[(byte)_s2[uVar24]];
            uVar24 = uVar24 + 1;
          } while (uVar55 != uVar24);
          *(undefined1 (*) [16])(*ptr + 0xe) = (undefined1  [16])0x0;
          *ptr = (undefined1  [16])0x0;
          uVar24 = (ulong)(uint)s2Len;
          uVar36 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar26) {
            uVar36 = uVar26;
          }
          uVar57 = 0;
          auVar72 = ZEXT1632(auVar77);
          memset(ptr[1] + uVar24 * 2 + 0xe,0,(ulong)(~s2Len + uVar36) * 2 + 2);
          iVar15 = iVar25;
          do {
            ptr_00[uVar57 + 0xf] = (int16_t)iVar15;
            iVar15 = iVar15 - gap;
            ptr_01[uVar57 + 0xf] = iVar69;
            uVar57 = uVar57 + 1;
          } while (uVar55 != uVar57);
          lVar20 = 0;
          do {
            ptr_00[lVar20] = iVar69;
            ptr_01[lVar20] = iVar69;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0xf);
          lVar20 = uVar24 + 0xf;
          do {
            ptr_00[lVar20] = iVar69;
            ptr_01[lVar20] = iVar69;
            lVar20 = lVar20 + 1;
            s2Len = s2Len + 1;
          } while (s2Len < (int)uVar26);
          ptr_00[0xe] = 0;
          if ((int)uVar29 < 1) {
            auVar72._2_2_ = iVar69;
            auVar72._0_2_ = iVar69;
            auVar72._4_2_ = iVar69;
            auVar72._6_2_ = iVar69;
            auVar72._8_2_ = iVar69;
            auVar72._10_2_ = iVar69;
            auVar72._12_2_ = iVar69;
            auVar72._14_2_ = iVar69;
            auVar72._16_2_ = iVar69;
            auVar72._18_2_ = iVar69;
            auVar72._20_2_ = iVar69;
            auVar72._22_2_ = iVar69;
            auVar72._24_2_ = iVar69;
            auVar72._26_2_ = iVar69;
            auVar72._28_2_ = iVar69;
            auVar72._30_2_ = iVar69;
            auVar68 = ZEXT3264(auVar72);
            auVar63._2_2_ = sVar27;
            auVar63._0_2_ = sVar27;
            auVar63._4_2_ = sVar27;
            auVar63._6_2_ = sVar27;
            auVar63._8_2_ = sVar27;
            auVar63._10_2_ = sVar27;
            auVar63._12_2_ = sVar27;
            auVar63._14_2_ = sVar27;
            auVar63._16_2_ = sVar27;
            auVar63._18_2_ = sVar27;
            auVar63._20_2_ = sVar27;
            auVar63._22_2_ = sVar27;
            auVar63._24_2_ = sVar27;
            auVar63._26_2_ = sVar27;
            auVar63._28_2_ = sVar27;
            auVar63._30_2_ = sVar27;
          }
          else {
            auVar12._2_2_ = iVar69;
            auVar12._0_2_ = iVar69;
            auVar12._4_2_ = iVar69;
            auVar12._6_2_ = iVar69;
            auVar12._8_2_ = iVar69;
            auVar12._10_2_ = iVar69;
            auVar12._12_2_ = iVar69;
            auVar12._14_2_ = iVar69;
            auVar12._16_2_ = iVar69;
            auVar12._18_2_ = iVar69;
            auVar12._20_2_ = iVar69;
            auVar12._22_2_ = iVar69;
            auVar12._24_2_ = iVar69;
            auVar12._26_2_ = iVar69;
            auVar12._28_2_ = iVar69;
            auVar12._30_2_ = iVar69;
            auVar68 = ZEXT3264(auVar12);
            auVar6 = vpalignr_avx2(ZEXT1632(auVar12._16_16_),auVar12,2);
            uVar55 = 1;
            if (1 < (int)uVar26) {
              uVar55 = (ulong)uVar26;
            }
            lVar20 = uVar24 * 0x40;
            local_210 = uVar24 * 0x3c + -0x3c;
            local_218 = uVar24 * 0x38 + -0x38;
            local_220 = uVar24 * 0x34 + -0x34;
            local_228 = uVar24 * 0x18 + -0x18;
            local_230 = uVar24 * 0xc + -0xc;
            local_238 = uVar24 * 0x30 + -0x30;
            local_240 = uVar24 * 0x2c + -0x2c;
            local_248 = uVar24 * 0x28 + -0x28;
            local_250 = uVar24 * 0x24 + -0x24;
            local_258 = uVar24 * 0x20 + -0x20;
            local_260 = uVar24 * 0x1c + -0x1c;
            local_268 = uVar24 * 0x14 + -0x14;
            local_270 = uVar24 * 0x10 + -0x10;
            auVar11 = vpmovsxbw_avx2(_DAT_008d4a84);
            auVar10 = vpcmpeqd_avx2(auVar72,auVar72);
            auVar73._8_2_ = 1;
            auVar73._0_8_ = 0x1000100010001;
            auVar73._10_2_ = 1;
            auVar73._12_2_ = 1;
            auVar73._14_2_ = 1;
            auVar73._16_2_ = 1;
            auVar73._18_2_ = 1;
            auVar73._20_2_ = 1;
            auVar73._22_2_ = 1;
            auVar73._24_2_ = 1;
            auVar73._26_2_ = 1;
            auVar73._28_2_ = 1;
            auVar73._30_2_ = 1;
            auVar64 = ZEXT3264(CONCAT230(sVar27,CONCAT228(sVar27,CONCAT226(sVar27,CONCAT224(sVar27,
                                                  CONCAT222(sVar27,CONCAT220(sVar27,CONCAT218(sVar27
                                                  ,CONCAT216(sVar27,CONCAT214(sVar27,CONCAT212(
                                                  sVar27,CONCAT210(sVar27,CONCAT28(sVar27,CONCAT26(
                                                  sVar27,CONCAT24(sVar27,CONCAT22(sVar27,sVar27)))))
                                                  )))))))))));
            auVar66 = ZEXT3264(auVar12);
            piVar3 = matrix->matrix;
            local_200 = uVar24 * 4 + -4;
            local_278 = uVar24 * 8 + -8;
            local_208 = 0;
            uVar57 = 0;
            do {
              iVar15 = matrix->type;
              uVar26 = (uint)uVar57;
              uVar29 = uVar26;
              if (iVar15 == 0) {
                uVar29 = (uint)ptr_02[uVar57];
              }
              uVar45 = uVar57 | 1;
              if (iVar15 == 0) {
                uVar36 = (int)ptr_02[uVar45];
              }
              else {
                uVar36 = local_334;
                if (uVar45 < uVar59) {
                  uVar36 = uVar26 | 1;
                }
              }
              uVar40 = uVar57 | 2;
              if (iVar15 == 0) {
                uVar30 = (int)ptr_02[uVar40];
              }
              else {
                uVar30 = local_334;
                if (uVar40 < uVar59) {
                  uVar30 = uVar26 | 2;
                }
              }
              uVar41 = uVar57 | 3;
              if (iVar15 == 0) {
                uVar31 = (int)ptr_02[uVar41];
              }
              else {
                uVar31 = local_334;
                if (uVar41 < uVar59) {
                  uVar31 = uVar26 | 3;
                }
              }
              uVar50 = uVar57 | 4;
              if (iVar15 == 0) {
                uVar32 = (int)ptr_02[uVar50];
              }
              else {
                uVar32 = local_334;
                if (uVar50 < uVar59) {
                  uVar32 = uVar26 | 4;
                }
              }
              uVar53 = uVar57 | 5;
              if (iVar15 == 0) {
                uVar33 = (int)ptr_02[uVar53];
              }
              else {
                uVar33 = local_334;
                if (uVar53 < uVar59) {
                  uVar33 = uVar26 | 5;
                }
              }
              uVar34 = uVar57 | 6;
              if (iVar15 == 0) {
                uVar58 = (int)ptr_02[uVar34];
              }
              else {
                uVar58 = local_334;
                if (uVar34 < uVar59) {
                  uVar58 = uVar26 | 6;
                }
              }
              iVar2 = matrix->size;
              uVar56 = uVar57 | 7;
              if (iVar15 == 0) {
                uVar16 = (int)ptr_02[uVar56];
              }
              else {
                uVar16 = local_334;
                if (uVar56 < uVar59) {
                  uVar16 = uVar26 | 7;
                }
              }
              uVar21 = uVar57 | 8;
              if (iVar15 == 0) {
                uVar51 = (int)ptr_02[uVar21];
              }
              else {
                uVar51 = local_334;
                if (uVar21 < uVar59) {
                  uVar51 = uVar26 | 8;
                }
              }
              uVar22 = uVar57 | 9;
              if (iVar15 == 0) {
                uVar52 = (int)ptr_02[uVar22];
              }
              else {
                uVar52 = local_334;
                if (uVar22 < uVar59) {
                  uVar52 = uVar26 | 9;
                }
              }
              uVar42 = uVar57 | 10;
              if (iVar15 == 0) {
                uVar48 = (int)ptr_02[uVar42];
              }
              else {
                uVar48 = local_334;
                if (uVar42 < uVar59) {
                  uVar48 = uVar26 | 10;
                }
              }
              uVar46 = uVar57 | 0xb;
              if (iVar15 == 0) {
                uVar37 = (int)ptr_02[uVar46];
              }
              else {
                uVar37 = local_334;
                if (uVar46 < uVar59) {
                  uVar37 = uVar26 | 0xb;
                }
              }
              uVar35 = uVar57 | 0xc;
              if (iVar15 == 0) {
                uVar38 = (int)ptr_02[uVar35];
              }
              else {
                uVar38 = local_334;
                if (uVar35 < uVar59) {
                  uVar38 = uVar26 | 0xc;
                }
              }
              uVar43 = uVar57 | 0xd;
              if (iVar15 == 0) {
                uVar49 = (int)ptr_02[uVar43];
              }
              else {
                uVar49 = local_334;
                if (uVar43 < uVar59) {
                  uVar49 = uVar26 | 0xd;
                }
              }
              uVar44 = uVar57 | 0xe;
              if (iVar15 == 0) {
                uVar39 = (int)ptr_02[uVar44];
              }
              else {
                uVar39 = local_334;
                if (uVar44 < uVar59) {
                  uVar39 = uVar26 | 0xe;
                }
              }
              uVar54 = uVar57 | 0xf;
              if (iVar15 == 0) {
                uVar17 = (int)ptr_02[uVar54];
              }
              else {
                uVar17 = local_334;
                if (uVar54 < uVar59) {
                  uVar17 = uVar26 | 0xf;
                }
              }
              uVar57 = uVar57 + 0x10;
              iVar1 = ptr_00[0xe];
              auVar71._2_2_ = iVar1;
              auVar71._0_2_ = iVar1;
              auVar71._4_2_ = iVar1;
              auVar71._6_2_ = iVar1;
              auVar71._8_2_ = iVar1;
              auVar71._10_2_ = iVar1;
              auVar71._12_2_ = iVar1;
              auVar71._14_2_ = iVar1;
              auVar71._16_2_ = iVar1;
              auVar71._18_2_ = iVar1;
              auVar71._20_2_ = iVar1;
              auVar71._22_2_ = iVar1;
              auVar71._24_2_ = iVar1;
              auVar71._26_2_ = iVar1;
              auVar71._28_2_ = iVar1;
              auVar71._30_2_ = iVar1;
              ptr_00[0xe] = (short)iVar25 - (short)uVar57 * sVar60;
              auVar76._0_2_ = (undefined2)(iVar25 - uVar26 * gap);
              auVar76._2_2_ = auVar76._0_2_;
              auVar76._4_2_ = auVar76._0_2_;
              auVar76._6_2_ = auVar76._0_2_;
              auVar76._8_2_ = auVar76._0_2_;
              auVar76._10_2_ = auVar76._0_2_;
              auVar76._12_2_ = auVar76._0_2_;
              auVar76._14_2_ = auVar76._0_2_;
              auVar76._16_2_ = auVar76._0_2_;
              auVar76._18_2_ = auVar76._0_2_;
              auVar76._20_2_ = auVar76._0_2_;
              auVar76._22_2_ = auVar76._0_2_;
              auVar76._24_2_ = auVar76._0_2_;
              auVar76._26_2_ = auVar76._0_2_;
              auVar76._28_2_ = auVar76._0_2_;
              auVar76._30_2_ = auVar76._0_2_;
              auVar72 = vpblendw_avx2(auVar6,auVar76,0x80);
              auVar76 = vpblendd_avx2(auVar6,auVar72,0xf0);
              auVar72 = vpblendw_avx2(auVar6,auVar71,0x80);
              auVar13 = vpblendd_avx2(auVar6,auVar72,0xf0);
              auVar9 = vpcmpeqw_avx2(auVar11,auVar61);
              auVar12 = vpmovsxbw_avx2(_DAT_008d4a94);
              auVar8._2_2_ = iVar69;
              auVar8._0_2_ = iVar69;
              auVar8._4_2_ = iVar69;
              auVar8._6_2_ = iVar69;
              auVar8._8_2_ = iVar69;
              auVar8._10_2_ = iVar69;
              auVar8._12_2_ = iVar69;
              auVar8._14_2_ = iVar69;
              auVar8._16_2_ = iVar69;
              auVar8._18_2_ = iVar69;
              auVar8._20_2_ = iVar69;
              auVar8._22_2_ = iVar69;
              auVar8._24_2_ = iVar69;
              auVar8._26_2_ = iVar69;
              auVar8._28_2_ = iVar69;
              auVar8._30_2_ = iVar69;
              uVar47 = 0;
              auVar71 = auVar8;
              do {
                auVar77 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar16 * iVar2) +
                                                           (long)*(short *)(ptr[1] + uVar47 * 2)]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(uVar58 * iVar2) +
                                                       (long)*(short *)(ptr[1] + uVar47 * 2 + 2)),1)
                ;
                auVar77 = vpinsrw_avx(auVar77,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar33 * iVar2) +
                                                               (long)*(short *)(ptr[1] + uVar47 * 2
                                                                                         + 4)),2);
                auVar77 = vpinsrw_avx(auVar77,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar32 * iVar2) +
                                                               (long)*(short *)(ptr[1] + uVar47 * 2
                                                                                         + 6)),3);
                auVar77 = vpinsrw_avx(auVar77,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar31 * iVar2) +
                                                               (long)*(short *)(ptr[1] + uVar47 * 2
                                                                                         + 8)),4);
                auVar77 = vpinsrw_avx(auVar77,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar30 * iVar2) +
                                                               (long)*(short *)(ptr[1] + uVar47 * 2
                                                                                         + 10)),5);
                auVar77 = vpinsrw_avx(auVar77,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar36 * iVar2) +
                                                               (long)*(short *)(ptr[1] + uVar47 * 2
                                                                                         + 0xc)),6);
                auVar77 = vpinsrw_avx(auVar77,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar29 * iVar2) +
                                                               (long)*(short *)(ptr[1] + uVar47 * 2
                                                                                         + 0xe)),7);
                auVar78 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar17 * iVar2) +
                                                           (long)*(short *)(*ptr + uVar47 * 2)]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(uVar39 * iVar2) +
                                                       (long)*(short *)(*ptr + uVar47 * 2 + 2)),1);
                auVar78 = vpinsrw_avx(auVar78,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar49 * iVar2) +
                                                               (long)*(short *)(*ptr + uVar47 * 2 +
                                                                                       4)),2);
                auVar78 = vpinsrw_avx(auVar78,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar38 * iVar2) +
                                                               (long)*(short *)(*ptr + uVar47 * 2 +
                                                                                       6)),3);
                auVar78 = vpinsrw_avx(auVar78,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar37 * iVar2) +
                                                               (long)*(short *)(*ptr + uVar47 * 2 +
                                                                                       8)),4);
                auVar78 = vpinsrw_avx(auVar78,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar48 * iVar2) +
                                                               (long)*(short *)(*ptr + uVar47 * 2 +
                                                                                       10)),5);
                auVar78 = vpinsrw_avx(auVar78,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar52 * iVar2) +
                                                               (long)*(short *)(*ptr + uVar47 * 2 +
                                                                                       0xc)),6);
                auVar78 = vpinsrw_avx(auVar78,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar51 * iVar2) +
                                                               (long)*(short *)(*ptr + uVar47 * 2 +
                                                                                       0xe)),7);
                iVar1 = ptr_00[uVar47 + 0xf];
                auVar74._2_2_ = iVar1;
                auVar74._0_2_ = iVar1;
                auVar74._4_2_ = iVar1;
                auVar74._6_2_ = iVar1;
                auVar74._8_2_ = iVar1;
                auVar74._10_2_ = iVar1;
                auVar74._12_2_ = iVar1;
                auVar74._14_2_ = iVar1;
                auVar74._16_2_ = iVar1;
                auVar74._18_2_ = iVar1;
                auVar74._20_2_ = iVar1;
                auVar74._22_2_ = iVar1;
                auVar74._24_2_ = iVar1;
                auVar74._26_2_ = iVar1;
                auVar74._28_2_ = iVar1;
                auVar74._30_2_ = iVar1;
                auVar79._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar78;
                auVar79._16_16_ = ZEXT116(1) * auVar77;
                auVar63 = vpalignr_avx2(ZEXT1632(auVar76._16_16_),auVar76,2);
                auVar7 = vpblendw_avx2(auVar63,auVar74,0x80);
                auVar72 = vpaddsw_avx2(auVar13,auVar79);
                auVar13 = vpblendd_avx2(auVar63,auVar7,0xf0);
                iVar1 = ptr_01[uVar47 + 0xf];
                auVar75._2_2_ = iVar1;
                auVar75._0_2_ = iVar1;
                auVar75._4_2_ = iVar1;
                auVar75._6_2_ = iVar1;
                auVar75._8_2_ = iVar1;
                auVar75._10_2_ = iVar1;
                auVar75._12_2_ = iVar1;
                auVar75._14_2_ = iVar1;
                auVar75._16_2_ = iVar1;
                auVar75._18_2_ = iVar1;
                auVar75._20_2_ = iVar1;
                auVar75._22_2_ = iVar1;
                auVar75._24_2_ = iVar1;
                auVar75._26_2_ = iVar1;
                auVar75._28_2_ = iVar1;
                auVar75._30_2_ = iVar1;
                auVar63 = vpalignr_avx2(ZEXT1632(auVar8._16_16_),auVar8,2);
                auVar8 = vpblendw_avx2(auVar63,auVar75,0x80);
                auVar8 = vpblendd_avx2(auVar63,auVar8,0xf0);
                auVar7._2_2_ = uVar62;
                auVar7._0_2_ = uVar62;
                auVar7._4_2_ = uVar62;
                auVar7._6_2_ = uVar62;
                auVar7._8_2_ = uVar62;
                auVar7._10_2_ = uVar62;
                auVar7._12_2_ = uVar62;
                auVar7._14_2_ = uVar62;
                auVar7._16_2_ = uVar62;
                auVar7._18_2_ = uVar62;
                auVar7._20_2_ = uVar62;
                auVar7._22_2_ = uVar62;
                auVar7._24_2_ = uVar62;
                auVar7._26_2_ = uVar62;
                auVar7._28_2_ = uVar62;
                auVar7._30_2_ = uVar62;
                auVar63 = vpsubsw_avx2(auVar13,auVar7);
                auVar8 = vpsubsw_avx2(auVar8,auVar70);
                auVar8 = vpmaxsw_avx2(auVar63,auVar8);
                auVar63 = vpsubsw_avx2(auVar76,auVar7);
                auVar76 = vpsubsw_avx2(auVar71,auVar70);
                auVar7 = vpmaxsw_avx2(auVar63,auVar76);
                auVar63 = vpmaxsw_avx2(auVar7,auVar8);
                auVar72 = vpmaxsw_avx2(auVar72,auVar63);
                auVar71 = vpcmpeqw_avx2(auVar12,auVar10);
                auVar76 = vpblendvb_avx2(auVar72,local_158,auVar71);
                if (0xf < uVar47) {
                  auVar72 = vpminsw_avx2(auVar76,auVar64._0_32_);
                  auVar64 = ZEXT3264(auVar72);
                  auVar72 = vpmaxsw_avx2(auVar76,auVar66._0_32_);
                  auVar66 = ZEXT3264(auVar72);
                }
                auVar72 = auVar66._0_32_;
                auVar63 = auVar64._0_32_;
                piVar4 = ((ppVar19->field_4).rowcols)->score_row;
                auVar77 = auVar76._0_16_;
                auVar78 = auVar76._16_16_;
                if (uVar47 < uVar24) {
                  uVar18 = vpextrw_avx(auVar78,7);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_208) = (int)(short)uVar18;
                }
                if (uVar47 - 1 < uVar24 && uVar45 < uVar59) {
                  uVar18 = vpextrw_avx(auVar78,6);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_200) = (int)(short)uVar18;
                }
                if ((uVar40 < uVar59) && ((long)(uVar47 - 2) < (long)uVar24 && 1 < uVar47)) {
                  uVar18 = vpextrw_avx(auVar78,5);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_278) = (int)(short)uVar18;
                }
                if ((uVar41 < uVar59) && ((long)(uVar47 - 3) < (long)uVar24 && 2 < uVar47)) {
                  uVar18 = vpextrw_avx(auVar78,4);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_230) = (int)(short)uVar18;
                }
                if ((uVar50 < uVar59) && ((long)(uVar47 - 4) < (long)uVar24 && 3 < uVar47)) {
                  uVar18 = vpextrw_avx(auVar78,3);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_270) = (int)(short)uVar18;
                }
                if ((uVar53 < uVar59) && ((long)(uVar47 - 5) < (long)uVar24 && 4 < uVar47)) {
                  uVar18 = vpextrw_avx(auVar78,2);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_268) = (int)(short)uVar18;
                }
                if ((uVar34 < uVar59) && ((long)(uVar47 - 6) < (long)uVar24 && 5 < uVar47)) {
                  uVar18 = vpextrw_avx(auVar78,1);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_228) = (int)(short)uVar18;
                }
                if ((uVar56 < uVar59) && ((long)(uVar47 - 7) < (long)uVar24 && 6 < uVar47)) {
                  *(int *)((long)piVar4 + uVar47 * 4 + local_260) = (int)auVar76._16_2_;
                }
                if ((uVar21 < uVar59) && ((long)(uVar47 - 8) < (long)uVar24 && 7 < uVar47)) {
                  uVar18 = vpextrw_avx(auVar77,7);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_258) = (int)(short)uVar18;
                }
                if ((uVar22 < uVar59) && ((long)(uVar47 - 9) < (long)uVar24 && 8 < uVar47)) {
                  uVar18 = vpextrw_avx(auVar77,6);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_250) = (int)(short)uVar18;
                }
                if ((uVar42 < uVar59) && ((long)(uVar47 - 10) < (long)uVar24 && 9 < uVar47)) {
                  uVar18 = vpextrw_avx(auVar77,5);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_248) = (int)(short)uVar18;
                }
                if ((uVar46 < uVar59) && ((long)(uVar47 - 0xb) < (long)uVar24 && 10 < uVar47)) {
                  uVar18 = vpextrw_avx(auVar77,4);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_240) = (int)(short)uVar18;
                }
                if ((uVar35 < uVar59) && ((long)(uVar47 - 0xc) < (long)uVar24 && 0xb < uVar47)) {
                  uVar18 = vpextrw_avx(auVar77,3);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_238) = (int)(short)uVar18;
                }
                if ((uVar43 < uVar59) && ((long)(uVar47 - 0xd) < (long)uVar24 && 0xc < uVar47)) {
                  uVar18 = vpextrw_avx(auVar77,2);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_220) = (int)(short)uVar18;
                }
                if ((uVar44 < uVar59) && ((long)(uVar47 - 0xe) < (long)uVar24 && 0xd < uVar47)) {
                  uVar18 = vpextrw_avx(auVar77,1);
                  *(int *)((long)piVar4 + uVar47 * 4 + local_218) = (int)(short)uVar18;
                }
                if ((uVar54 < uVar59) && ((long)(uVar47 - 0xf) < (long)uVar24 && 0xe < uVar47)) {
                  *(int *)((long)piVar4 + uVar47 * 4 + local_210) = (int)auVar76._0_2_;
                }
                auVar14._2_2_ = iVar69;
                auVar14._0_2_ = iVar69;
                auVar14._4_2_ = iVar69;
                auVar14._6_2_ = iVar69;
                auVar14._8_2_ = iVar69;
                auVar14._10_2_ = iVar69;
                auVar14._12_2_ = iVar69;
                auVar14._14_2_ = iVar69;
                auVar14._16_2_ = iVar69;
                auVar14._18_2_ = iVar69;
                auVar14._20_2_ = iVar69;
                auVar14._22_2_ = iVar69;
                auVar14._24_2_ = iVar69;
                auVar14._26_2_ = iVar69;
                auVar14._28_2_ = iVar69;
                auVar14._30_2_ = iVar69;
                auVar8 = vpblendvb_avx2(auVar8,auVar14,auVar71);
                auVar71 = vpblendvb_avx2(auVar7,auVar14,auVar71);
                vpextrw_avx(auVar77,0);
                vpextrw_avx(auVar8._0_16_,0);
                auVar7 = vpcmpeqw_avx2(auVar12,auVar67);
                auVar7 = vpand_avx2(auVar9,auVar7);
                auVar7 = vpblendvb_avx2(auVar68._0_32_,auVar76,auVar7);
                auVar68 = ZEXT3264(auVar7);
                auVar12 = vpaddsw_avx2(auVar12,auVar73);
                uVar47 = uVar47 + 1;
              } while (uVar55 != uVar47);
              auVar9._8_2_ = 0x10;
              auVar9._0_8_ = 0x10001000100010;
              auVar9._10_2_ = 0x10;
              auVar9._12_2_ = 0x10;
              auVar9._14_2_ = 0x10;
              auVar9._16_2_ = 0x10;
              auVar9._18_2_ = 0x10;
              auVar9._20_2_ = 0x10;
              auVar9._22_2_ = 0x10;
              auVar9._24_2_ = 0x10;
              auVar9._26_2_ = 0x10;
              auVar9._28_2_ = 0x10;
              auVar9._30_2_ = 0x10;
              auVar11 = vpaddsw_avx2(auVar11,auVar9);
              local_158 = vpsubsw_avx2(local_158,auVar65);
              local_208 = local_208 + lVar20;
              local_200 = local_200 + lVar20;
              local_210 = local_210 + lVar20;
              local_218 = local_218 + lVar20;
              local_220 = local_220 + lVar20;
              local_238 = local_238 + lVar20;
              local_240 = local_240 + lVar20;
              local_248 = local_248 + lVar20;
              local_250 = local_250 + lVar20;
              local_258 = local_258 + lVar20;
              local_260 = local_260 + lVar20;
              local_228 = local_228 + lVar20;
              local_268 = local_268 + lVar20;
              local_270 = local_270 + lVar20;
              local_230 = local_230 + lVar20;
              local_278 = local_278 + lVar20;
            } while (uVar57 < uVar59);
          }
          iVar25 = 0x10;
          do {
            iVar15 = vpextrw_avx(auVar68._16_16_,7);
            if ((short)iVar15 <= (short)iVar28) {
              iVar15 = iVar28;
            }
            iVar28 = iVar15;
            sVar60 = (short)iVar28;
            auVar67 = auVar68._0_32_;
            auVar61 = vperm2i128_avx2(auVar67,auVar67,0x28);
            auVar61 = vpalignr_avx2(auVar67,auVar61,0xe);
            auVar68 = ZEXT3264(auVar61);
            iVar25 = iVar25 + -1;
          } while (iVar25 != 0);
          auVar67._2_2_ = iVar69;
          auVar67._0_2_ = iVar69;
          auVar67._4_2_ = iVar69;
          auVar67._6_2_ = iVar69;
          auVar67._8_2_ = iVar69;
          auVar67._10_2_ = iVar69;
          auVar67._12_2_ = iVar69;
          auVar67._14_2_ = iVar69;
          auVar67._16_2_ = iVar69;
          auVar67._18_2_ = iVar69;
          auVar67._20_2_ = iVar69;
          auVar67._22_2_ = iVar69;
          auVar67._24_2_ = iVar69;
          auVar67._26_2_ = iVar69;
          auVar67._28_2_ = iVar69;
          auVar67._30_2_ = iVar69;
          auVar61 = vpcmpgtw_avx2(auVar67,auVar63);
          auVar6._2_2_ = sVar27;
          auVar6._0_2_ = sVar27;
          auVar6._4_2_ = sVar27;
          auVar6._6_2_ = sVar27;
          auVar6._8_2_ = sVar27;
          auVar6._10_2_ = sVar27;
          auVar6._12_2_ = sVar27;
          auVar6._14_2_ = sVar27;
          auVar6._16_2_ = sVar27;
          auVar6._18_2_ = sVar27;
          auVar6._20_2_ = sVar27;
          auVar6._22_2_ = sVar27;
          auVar6._24_2_ = sVar27;
          auVar6._26_2_ = sVar27;
          auVar6._28_2_ = sVar27;
          auVar6._30_2_ = sVar27;
          auVar67 = vpcmpgtw_avx2(auVar72,auVar6);
          auVar61 = vpor_avx2(auVar61,auVar67);
          if ((((((((((((((((((((((((((((((((auVar61 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar61 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar61 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar61 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar61 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar61 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar61 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar61 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar61 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar61 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar61 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar61 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar61 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar61 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar61 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar61 >> 0x7f,0) != '\0') ||
                            (auVar61 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar61 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar61 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar61 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar61 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar61 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar61 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar61 >> 0xbf,0) != '\0') ||
                    (auVar61 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar61 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar61 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar61 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar61 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar61 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar61 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              auVar61[0x1f] < '\0') {
            *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
            sVar60 = 0;
            iVar23 = 0;
            local_334 = 0;
          }
          ppVar19->score = (int)sVar60;
          ppVar19->end_query = local_334;
          ppVar19->end_ref = iVar23;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar19;
          }
          return ppVar19;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vGapN = _mm256_set1_epi16(gap*N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vILimit1 = _mm256_subs_epi16(vILimit, vOne);
    vJLimit = _mm256_set1_epi16(s2Len);
    vJLimit1 = _mm256_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm256_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        vNH = _mm256_srli_si256_rpl(vNH, 2);
        vNH = _mm256_insert_epi16_rpl(vNH, H_pr[-1], 15);
        vWH = _mm256_srli_si256_rpl(vWH, 2);
        vWH = _mm256_insert_epi16_rpl(vWH, -open - i*gap, 15);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi16(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi16(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
        vIBoundary = _mm256_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm256_extract_epi16_rpl(vMax, 15);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 2);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}